

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_entities(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  xmlDocPtr pxVar10;
  long lVar11;
  xmlBufferPtr pxVar12;
  ulong uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  int test_ret_9;
  ulong uVar16;
  ulong *puVar17;
  int n_buf;
  int iVar18;
  ulong in_RSI;
  ulong uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  uint uVar22;
  undefined8 *puVar23;
  int n_content;
  uint uVar24;
  int n_content_1;
  int test_ret_3;
  int test_ret_1;
  int test_ret_2;
  int test_ret_4;
  int test_ret;
  uint local_60;
  int local_5c;
  int local_44;
  
  if (quiet == '\0') {
    puts("Testing entities : 13 of 17 functions ...");
  }
  local_44 = 0;
  local_60 = 0;
  do {
    uVar22 = 0;
    do {
      uVar1 = 0;
      do {
        uVar4 = 0;
        do {
          uVar16 = 0;
          do {
            puVar23 = &DAT_00165d70;
            uVar13 = 0;
            do {
              iVar3 = (int)in_RSI;
              iVar2 = xmlMemBlocks();
              pxVar10 = gen_xmlDocPtr(local_60,iVar3);
              if (uVar22 < 4) {
                in_RSI = (&DAT_00165d70)[uVar22];
              }
              else {
                in_RSI = 0;
              }
              uVar15 = 0xffffffff;
              if (uVar1 < 4) {
                uVar15 = (&DAT_00163454)[uVar1];
              }
              if (uVar4 < 4) {
                uVar14 = (&DAT_00165d70)[uVar4];
              }
              else {
                uVar14 = 0;
              }
              if ((uint)uVar16 < 4) {
                uVar20 = (&DAT_00165d70)[uVar16];
              }
              else {
                uVar20 = 0;
              }
              uVar24 = (uint)uVar13;
              if (uVar24 < 4) {
                uVar21 = *puVar23;
              }
              else {
                uVar21 = 0;
              }
              lVar11 = xmlAddDocEntity(pxVar10,in_RSI,uVar15,uVar14,uVar20,uVar21);
              if (lVar11 != 0) {
                xmlUnlinkNode(lVar11);
                xmlFreeNode(lVar11);
              }
              call_tests = call_tests + 1;
              if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar10);
              }
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar2 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDocEntity",(ulong)(uint)(iVar3 - iVar2));
                local_44 = local_44 + 1;
                printf(" %d",(ulong)local_60);
                printf(" %d",(ulong)uVar22);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar4);
                printf(" %d",uVar16);
                printf(" %d");
                putchar(10);
                in_RSI = uVar13;
              }
              uVar24 = uVar24 + 1;
              uVar13 = (ulong)uVar24;
              puVar23 = puVar23 + 1;
            } while (uVar24 != 5);
            uVar24 = (uint)uVar16 + 1;
            uVar16 = (ulong)uVar24;
          } while (uVar24 != 5);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 5);
        uVar1 = uVar1 + 1;
      } while (uVar1 != 4);
      uVar22 = uVar22 + 1;
    } while (uVar22 != 5);
    local_60 = local_60 + 1;
  } while (local_60 != 4);
  function_tests = function_tests + 1;
  local_5c = 0;
  local_60 = 0;
  do {
    uVar22 = 0;
    do {
      uVar1 = 0;
      do {
        uVar4 = 0;
        do {
          uVar16 = 0;
          do {
            puVar23 = &DAT_00165d70;
            uVar13 = 0;
            do {
              iVar3 = (int)in_RSI;
              iVar2 = xmlMemBlocks();
              pxVar10 = gen_xmlDocPtr(local_60,iVar3);
              if (uVar22 < 4) {
                in_RSI = (&DAT_00165d70)[uVar22];
              }
              else {
                in_RSI = 0;
              }
              uVar15 = 0xffffffff;
              if (uVar1 < 4) {
                uVar15 = (&DAT_00163454)[uVar1];
              }
              if (uVar4 < 4) {
                uVar14 = (&DAT_00165d70)[uVar4];
              }
              else {
                uVar14 = 0;
              }
              if ((uint)uVar16 < 4) {
                uVar20 = (&DAT_00165d70)[uVar16];
              }
              else {
                uVar20 = 0;
              }
              uVar24 = (uint)uVar13;
              if (uVar24 < 4) {
                uVar21 = *puVar23;
              }
              else {
                uVar21 = 0;
              }
              lVar11 = xmlAddDtdEntity(pxVar10,in_RSI,uVar15,uVar14,uVar20,uVar21);
              if (lVar11 != 0) {
                xmlUnlinkNode(lVar11);
                xmlFreeNode(lVar11);
              }
              call_tests = call_tests + 1;
              if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar10);
              }
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar2 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDtdEntity",(ulong)(uint)(iVar3 - iVar2));
                local_5c = local_5c + 1;
                printf(" %d",(ulong)local_60);
                printf(" %d",(ulong)uVar22);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar4);
                printf(" %d",uVar16);
                printf(" %d");
                putchar(10);
                in_RSI = uVar13;
              }
              uVar24 = uVar24 + 1;
              uVar13 = (ulong)uVar24;
              puVar23 = puVar23 + 1;
            } while (uVar24 != 5);
            uVar24 = (uint)uVar16 + 1;
            uVar16 = (ulong)uVar24;
          } while (uVar24 != 5);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 5);
        uVar1 = uVar1 + 1;
      } while (uVar1 != 4);
      uVar22 = uVar22 + 1;
    } while (uVar22 != 5);
    local_60 = local_60 + 1;
  } while (local_60 != 4);
  function_tests = function_tests + 1;
  iVar2 = xmlMemBlocks();
  xmlCleanupPredefinedEntities();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    iVar5 = xmlMemBlocks();
    in_RSI = (ulong)(uint)(iVar5 - iVar2);
    printf("Leak of %d blocks found in xmlCleanupPredefinedEntities");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  iVar18 = 0;
  do {
    iVar7 = (int)in_RSI;
    iVar6 = xmlMemBlocks();
    pxVar12 = gen_xmlBufferPtr(iVar18,iVar7);
    in_RSI = 0;
    xmlDumpEntitiesTable(pxVar12);
    call_tests = call_tests + 1;
    if (pxVar12 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar12);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpEntitiesTable",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      in_RSI = 0;
      printf(" %d");
      putchar(10);
    }
    iVar18 = iVar18 + 1;
  } while (iVar18 != 3);
  function_tests = function_tests + 1;
  local_60 = 0;
  iVar18 = 0;
  do {
    iVar7 = (int)in_RSI;
    iVar6 = xmlMemBlocks();
    pxVar12 = gen_xmlBufferPtr(iVar18,iVar7);
    in_RSI = 0;
    xmlDumpEntityDecl(pxVar12);
    call_tests = call_tests + 1;
    if (pxVar12 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar12);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpEntityDecl",(ulong)(uint)(iVar7 - iVar6));
      local_60 = local_60 + 1;
      printf(" %d");
      in_RSI = 0;
      printf(" %d");
      putchar(10);
    }
    iVar18 = iVar18 + 1;
  } while (iVar18 != 3);
  function_tests = function_tests + 1;
  iVar18 = 0;
  uVar22 = 0;
  do {
    puVar17 = &DAT_00165d70;
    uVar16 = 0;
    do {
      iVar7 = (int)in_RSI;
      iVar6 = xmlMemBlocks();
      pxVar10 = gen_xmlDocPtr(uVar22,iVar7);
      uVar1 = (uint)uVar16;
      if (uVar1 < 4) {
        in_RSI = *puVar17;
      }
      else {
        in_RSI = 0;
      }
      lVar11 = xmlEncodeEntitiesReentrant(pxVar10);
      if (lVar11 != 0) {
        (*_xmlFree)(lVar11);
      }
      call_tests = call_tests + 1;
      if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)) {
        xmlFreeDoc(pxVar10);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlEncodeEntitiesReentrant",(ulong)(uint)(iVar7 - iVar6))
        ;
        iVar18 = iVar18 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d");
        putchar(10);
        in_RSI = uVar16;
      }
      uVar1 = uVar1 + 1;
      uVar16 = (ulong)uVar1;
      puVar17 = puVar17 + 1;
    } while (uVar1 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 4);
  function_tests = function_tests + 1;
  iVar7 = 0;
  iVar6 = 0;
  do {
    iVar8 = xmlMemBlocks();
    lVar11 = xmlEncodeSpecialChars(0);
    if (lVar11 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlEncodeSpecialChars",(ulong)(uint)(iVar9 - iVar8));
      iVar6 = iVar6 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 5);
  iVar2 = local_5c + local_44 + (uint)(iVar2 != iVar3) + iVar5 + local_60;
  function_tests = function_tests + 1;
  puVar17 = &DAT_00165d70;
  uVar22 = 0;
  local_60 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar22 < 4) {
      uVar16 = *puVar17;
    }
    else {
      uVar16 = 0;
    }
    lVar11 = xmlGetDocEntity(0);
    if (lVar11 != 0) {
      xmlUnlinkNode(lVar11);
      xmlFreeNode();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar3 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetDocEntity",(ulong)(uint)(iVar5 - iVar3));
      local_60 = local_60 + 1;
      printf(" %d",0);
      uVar16 = (ulong)uVar22;
      printf(" %d");
      putchar(10);
    }
    uVar22 = uVar22 + 1;
    puVar17 = puVar17 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar22 = 0;
  do {
    puVar17 = &DAT_00165d70;
    uVar13 = 0;
    do {
      iVar7 = (int)uVar16;
      iVar5 = xmlMemBlocks();
      pxVar10 = gen_xmlDocPtr(uVar22,iVar7);
      uVar1 = (uint)uVar13;
      if (uVar1 < 4) {
        uVar16 = *puVar17;
      }
      else {
        uVar16 = 0;
      }
      lVar11 = xmlGetDtdEntity(pxVar10);
      if (lVar11 != 0) {
        xmlUnlinkNode(lVar11);
        xmlFreeNode(lVar11);
      }
      call_tests = call_tests + 1;
      if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)) {
        xmlFreeDoc(pxVar10);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar5 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetDtdEntity",(ulong)(uint)(iVar7 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d");
        putchar(10);
        uVar16 = uVar13;
      }
      uVar1 = uVar1 + 1;
      uVar13 = (ulong)uVar1;
      puVar17 = puVar17 + 1;
    } while (uVar1 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar22 = 0;
  do {
    puVar17 = &DAT_00165d70;
    uVar13 = 0;
    do {
      iVar8 = (int)uVar16;
      iVar7 = xmlMemBlocks();
      pxVar10 = gen_xmlDocPtr(uVar22,iVar8);
      uVar1 = (uint)uVar13;
      if (uVar1 < 4) {
        uVar16 = *puVar17;
      }
      else {
        uVar16 = 0;
      }
      lVar11 = xmlGetParameterEntity(pxVar10);
      if (lVar11 != 0) {
        xmlUnlinkNode(lVar11);
        xmlFreeNode(lVar11);
      }
      call_tests = call_tests + 1;
      if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)) {
        xmlFreeDoc(pxVar10);
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetParameterEntity",(ulong)(uint)(iVar8 - iVar7));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d");
        putchar(10);
        uVar16 = uVar13;
      }
      uVar1 = uVar1 + 1;
      uVar13 = (ulong)uVar1;
      puVar17 = puVar17 + 1;
    } while (uVar1 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 4);
  iVar2 = iVar2 + iVar18 + iVar6 + local_60;
  function_tests = function_tests + 1;
  puVar23 = &DAT_00165d70;
  uVar22 = 0;
  iVar18 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar22 < 4) {
      uVar14 = *puVar23;
    }
    else {
      uVar14 = 0;
    }
    lVar11 = xmlGetPredefinedEntity(uVar14);
    if (lVar11 != 0) {
      xmlUnlinkNode(lVar11);
      xmlFreeNode();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetPredefinedEntity",(ulong)(uint)(iVar7 - iVar6));
      iVar18 = iVar18 + 1;
      uVar16 = (ulong)uVar22;
      printf(" %d");
      putchar(10);
    }
    uVar22 = uVar22 + 1;
    puVar23 = puVar23 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  xmlInitializePredefinedEntities();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    iVar8 = xmlMemBlocks();
    uVar16 = (ulong)(uint)(iVar8 - iVar6);
    printf("Leak of %d blocks found in xmlInitializePredefinedEntities");
    putchar(10);
  }
  function_tests = function_tests + 1;
  local_44 = 0;
  local_60 = 0;
  do {
    uVar22 = 0;
    do {
      uVar13 = 0;
      do {
        uVar1 = 0;
        do {
          uVar4 = 0;
          do {
            uVar19 = 0;
            puVar23 = &DAT_00165d70;
            do {
              iVar9 = (int)uVar16;
              iVar8 = xmlMemBlocks();
              pxVar10 = gen_xmlDocPtr(local_60,iVar9);
              if (uVar22 < 4) {
                uVar16 = (&DAT_00165d70)[uVar22];
              }
              else {
                uVar16 = 0;
              }
              uVar15 = 0xffffffff;
              if ((uint)uVar13 < 4) {
                uVar15 = (&DAT_00163454)[uVar13];
              }
              if (uVar1 < 4) {
                uVar14 = (&DAT_00165d70)[uVar1];
              }
              else {
                uVar14 = 0;
              }
              if (uVar4 < 4) {
                uVar20 = (&DAT_00165d70)[uVar4];
              }
              else {
                uVar20 = 0;
              }
              uVar24 = (uint)uVar19;
              if (uVar24 < 4) {
                uVar21 = *puVar23;
              }
              else {
                uVar21 = 0;
              }
              lVar11 = xmlNewEntity(pxVar10,uVar16,uVar15,uVar14,uVar20,uVar21);
              if (lVar11 != 0) {
                xmlUnlinkNode(lVar11);
                xmlFreeNode(lVar11);
              }
              call_tests = call_tests + 1;
              if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar10);
              }
              xmlResetLastError();
              iVar9 = xmlMemBlocks();
              if (iVar8 != iVar9) {
                iVar9 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlNewEntity",(ulong)(uint)(iVar9 - iVar8));
                local_44 = local_44 + 1;
                printf(" %d",(ulong)local_60);
                printf(" %d",(ulong)uVar22);
                printf(" %d",uVar13);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar4);
                printf(" %d");
                putchar(10);
                uVar16 = uVar19;
              }
              uVar24 = uVar24 + 1;
              uVar19 = (ulong)uVar24;
              puVar23 = puVar23 + 1;
            } while (uVar24 != 5);
            uVar4 = uVar4 + 1;
          } while (uVar4 != 5);
          uVar1 = uVar1 + 1;
        } while (uVar1 != 5);
        uVar1 = (uint)uVar13 + 1;
        uVar13 = (ulong)uVar1;
      } while (uVar1 != 4);
      uVar22 = uVar22 + 1;
    } while (uVar22 != 5);
    local_60 = local_60 + 1;
  } while (local_60 != 4);
  function_tests = function_tests + 1;
  uVar22 = iVar2 + iVar3 + iVar5 + iVar18 + (uint)(iVar6 != iVar7) + local_44;
  if (uVar22 != 0) {
    printf("Module entities: %d errors\n",(ulong)uVar22);
  }
  return uVar22;
}

Assistant:

static int
test_entities(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing entities : 13 of 17 functions ...\n");
    test_ret += test_xmlAddDocEntity();
    test_ret += test_xmlAddDtdEntity();
    test_ret += test_xmlCleanupPredefinedEntities();
    test_ret += test_xmlCopyEntitiesTable();
    test_ret += test_xmlCreateEntitiesTable();
    test_ret += test_xmlDumpEntitiesTable();
    test_ret += test_xmlDumpEntityDecl();
    test_ret += test_xmlEncodeEntitiesReentrant();
    test_ret += test_xmlEncodeSpecialChars();
    test_ret += test_xmlGetDocEntity();
    test_ret += test_xmlGetDtdEntity();
    test_ret += test_xmlGetParameterEntity();
    test_ret += test_xmlGetPredefinedEntity();
    test_ret += test_xmlInitializePredefinedEntities();
    test_ret += test_xmlNewEntity();

    if (test_ret != 0)
	printf("Module entities: %d errors\n", test_ret);
    return(test_ret);
}